

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CS248::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  XMLElement *xml_00;
  XMLElement *xml_01;
  CameraInfo *camera;
  LightInfo *this;
  PolymeshInfo *polymesh;
  MaterialInfo *pMVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  string *psVar10;
  Matrix4x4 *pMVar11;
  Matrix4x4 *pMVar12;
  Matrix4x4 *pMVar13;
  double *pdVar14;
  int i;
  byte bVar15;
  Matrix4x4 mat;
  string s_1;
  string sid;
  string name;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string s;
  Node node;
  Matrix4x4 transform_save;
  
  bVar15 = 0;
  Node::Node(&node);
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&node);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&node.name);
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  do {
    if (pXVar4 == (XMLElement *)0x0) break;
    pcVar5 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
    std::__cxx11::string::string((string *)&name,pcVar5,(allocator *)&transform_save);
    bVar2 = std::operator==(&name,"matrix");
    if (bVar2) {
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&s,pcVar5,(allocator *)&transform_save);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&transform_save,(string *)&s,_S_out|_S_in);
      mat.entries[3].z = 0.0;
      mat.entries[3].w = 0.0;
      mat.entries[3].x = 0.0;
      mat.entries[3].y = 0.0;
      mat.entries[2].z = 0.0;
      mat.entries[2].w = 0.0;
      mat.entries[2].x = 0.0;
      mat.entries[2].y = 0.0;
      mat.entries[1].z = 0.0;
      mat.entries[1].w = 0.0;
      mat.entries[1].x = 0.0;
      mat.entries[1].y = 0.0;
      mat.entries[0].z = 0.0;
      mat.entries[0].w = 0.0;
      mat.entries[0].x = 0.0;
      mat.entries[0].y = 0.0;
      Matrix4x4::operator()(&mat,0,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      pMVar12 = &mat;
      pMVar11 = &node.transform;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pMVar11->entries[0].x = *(double *)pMVar12;
        pMVar12 = (Matrix4x4 *)((long)pMVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        pMVar11 = (Matrix4x4 *)((long)pMVar11 + (ulong)bVar15 * -0x10 + 8);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      bVar3 = std::operator==(&name,"rotate");
      if (bVar3) {
        mat.entries[3].z = 0.0;
        mat.entries[3].w = 0.0;
        mat.entries[3].x = 0.0;
        mat.entries[3].y = 0.0;
        mat.entries[2].z = 0.0;
        mat.entries[2].w = 0.0;
        mat.entries[2].x = 0.0;
        mat.entries[2].y = 0.0;
        mat.entries[1].z = 0.0;
        mat.entries[1].w = 0.0;
        mat.entries[1].x = 0.0;
        mat.entries[1].y = 0.0;
        mat.entries[0].z = 0.0;
        mat.entries[0].w = 0.0;
        mat.entries[0].x = 0.0;
        mat.entries[0].y = 0.0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"sid",(char *)0x0);
        std::__cxx11::string::string((string *)&sid,pcVar5,(allocator *)&s);
        cVar1 = sid._M_dataplus._M_p[sid._M_string_length - 1];
        if (cVar1 == 'X') {
          Matrix4x4::operator()(&mat,1,1);
          std::istream::_M_extract<double>((double *)&transform_save);
          Matrix4x4::operator()(&mat,1,2);
          std::istream::_M_extract<double>((double *)&transform_save);
          i = 2;
          iVar9 = 1;
LAB_00172ac9:
          Matrix4x4::operator()(&mat,i,iVar9);
          std::istream::_M_extract<double>((double *)&transform_save);
          iVar9 = 2;
LAB_00172ae2:
          Matrix4x4::operator()(&mat,iVar9,iVar9);
          std::istream::_M_extract<double>((double *)&transform_save);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()(&mat,0,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,2,0);
            i = 0;
            std::istream::_M_extract<double>((double *)&transform_save);
            iVar9 = 2;
            goto LAB_00172ac9;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()(&mat,0,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,0,1);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,1,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            iVar9 = 1;
            goto LAB_00172ae2;
          }
        }
        Matrix4x4::operator*((Matrix4x4 *)&s,&mat,&node.transform);
        psVar10 = &s;
        pMVar12 = &node.transform;
        for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
          pMVar12->entries[0].x = ((Vector4D *)&psVar10->_M_dataplus)->x;
          psVar10 = (string *)((long)psVar10 + (ulong)bVar15 * -0x10 + 8);
          pMVar12 = (Matrix4x4 *)((long)pMVar12 + (ulong)bVar15 * -0x10 + 8);
        }
        std::__cxx11::string::~string((string *)&sid);
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      bVar3 = std::operator==(&name,"translate");
      if (bVar3) {
        mat.entries[3].z = 0.0;
        mat.entries[3].w = 0.0;
        mat.entries[3].x = 0.0;
        mat.entries[3].y = 0.0;
        mat.entries[2].z = 0.0;
        mat.entries[2].w = 0.0;
        mat.entries[2].x = 0.0;
        mat.entries[2].y = 0.0;
        mat.entries[1].z = 0.0;
        mat.entries[1].w = 0.0;
        mat.entries[1].x = 0.0;
        mat.entries[1].y = 0.0;
        mat.entries[0].z = 0.0;
        mat.entries[0].w = 0.0;
        mat.entries[0].x = 0.0;
        mat.entries[0].y = 0.0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        Matrix4x4::operator()(&mat,0,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,2,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator*((Matrix4x4 *)&s,&mat,&node.transform);
        psVar10 = &s;
        pMVar12 = &node.transform;
        for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
          pMVar12->entries[0].x = ((Vector4D *)&psVar10->_M_dataplus)->x;
          psVar10 = (string *)((long)psVar10 + (ulong)bVar15 * -0x10 + 8);
          pMVar12 = (Matrix4x4 *)((long)pMVar12 + (ulong)bVar15 * -0x10 + 8);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      bVar3 = std::operator==(&name,"scale");
      if (bVar3) {
        mat.entries[3].z = 0.0;
        mat.entries[3].w = 0.0;
        mat.entries[3].x = 0.0;
        mat.entries[3].y = 0.0;
        mat.entries[2].z = 0.0;
        mat.entries[2].w = 0.0;
        mat.entries[2].x = 0.0;
        mat.entries[2].y = 0.0;
        mat.entries[1].z = 0.0;
        mat.entries[1].w = 0.0;
        mat.entries[1].x = 0.0;
        mat.entries[1].y = 0.0;
        mat.entries[0].z = 0.0;
        mat.entries[0].w = 0.0;
        mat.entries[0].x = 0.0;
        mat.entries[0].y = 0.0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        Matrix4x4::operator()(&mat,0,0);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,1);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,1);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator*((Matrix4x4 *)&s,&mat,&node.transform);
        psVar10 = &s;
        pMVar12 = &node.transform;
        for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
          pMVar12->entries[0].x = ((Vector4D *)&psVar10->_M_dataplus)->x;
          psVar10 = (string *)((long)psVar10 + (ulong)bVar15 * -0x10 + 8);
          pMVar12 = (Matrix4x4 *)((long)pMVar12 + (ulong)bVar15 * -0x10 + 8);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&name);
  } while (!bVar2);
  Matrix4x4::Matrix4x4(&transform_save,(Matrix4x4 *)&transform);
  pMVar12 = &node.transform;
  Matrix4x4::operator*(&mat,(Matrix4x4 *)&transform,pMVar12);
  lVar7 = 0x10;
  pMVar11 = &mat;
  pMVar13 = pMVar12;
  for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
    pMVar13->entries[0].x = *(double *)pMVar11;
    pMVar11 = (Matrix4x4 *)((long)pMVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    pMVar13 = (Matrix4x4 *)((long)pMVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  pdVar14 = (double *)&transform;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar14 = pMVar12->entries[0].x;
    pMVar12 = (Matrix4x4 *)((long)pMVar12 + (ulong)bVar15 * -0x10 + 8);
    pdVar14 = pdVar14 + (ulong)bVar15 * -2 + 1;
  }
  std::__cxx11::string::string((string *)&local_320,"node",(allocator *)&mat);
  pXVar4 = get_element(xml,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  for (; pXVar4 != (XMLElement *)0x0;
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
    parse_node(pXVar4);
  }
  pMVar12 = &transform_save;
  pdVar14 = (double *)&transform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar14 = pMVar12->entries[0].x;
    pMVar12 = (Matrix4x4 *)((long)pMVar12 + ((ulong)bVar15 * -2 + 1) * 8);
    pdVar14 = pdVar14 + (ulong)bVar15 * -2 + 1;
  }
  std::__cxx11::string::string((string *)&local_340,"instance_camera",(allocator *)&mat);
  pXVar4 = get_element(xml,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string((string *)&local_360,"instance_light",(allocator *)&mat);
  xml_00 = get_element(xml,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::string((string *)&local_380,"instance_geometry",(allocator *)&mat);
  xml_01 = get_element(xml,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  if (pXVar4 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        std::__cxx11::string::string((string *)&local_3a0,"mesh",(allocator *)&mat);
        pXVar4 = get_element(xml_01,&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        if (pXVar4 == (XMLElement *)0x0) {
          std::__cxx11::string::string((string *)&local_400,"extra",(allocator *)&mat);
          pXVar4 = get_element(xml_01,&local_400);
          std::__cxx11::string::~string((string *)&local_400);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_00172f49;
          polymesh = (PolymeshInfo *)operator_new(0x58);
          *(undefined8 *)&polymesh->super_Instance = 0;
          (polymesh->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (polymesh->super_Instance).id._M_string_length = 0;
          (polymesh->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(polymesh->super_Instance).id.field_2 + 8) = 0;
          (polymesh->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (polymesh->super_Instance).name._M_string_length = 0;
          (polymesh->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(polymesh->super_Instance).name.field_2 + 8) = 0;
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (polymesh->super_Instance).id._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).id.field_2;
          (polymesh->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (polymesh->super_Instance).name._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).name.field_2;
          (polymesh->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)polymesh);
          std::__cxx11::string::string
                    ((string *)&local_420,
                     "instance_geometry/bind_material/technique_common/instance_material",
                     (allocator *)&mat);
          pXVar4 = get_element(xml,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          node.instance = (Instance *)polymesh;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_00172f49;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar5 == (char *)0x0) goto LAB_001732cb;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          std::__cxx11::string::string((string *)&mat,pcVar5 + 1,(allocator *)&s);
          std::__cxx11::string::string((string *)&local_440,(string *)&mat);
          pXVar4 = uri_find(&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001732cb;
          pMVar6 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar6->super_Instance = 0;
          (pMVar6->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar6->super_Instance).id._M_string_length = 0;
          (pMVar6->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar6->super_Instance).id.field_2 + 8) = 0;
          (pMVar6->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar6->super_Instance).name._M_string_length = 0;
          (pMVar6->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar6->super_Instance).name.field_2 + 8) = 0;
          pMVar6->bsdf = (BSDF *)0x0;
          (pMVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).id.field_2;
          (pMVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).name.field_2;
          (pMVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar6);
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar6;
        }
        else {
          polymesh = (PolymeshInfo *)operator_new(0xb0);
          memset(polymesh,0,0xb0);
          (polymesh->super_Instance).id._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).id.field_2;
          (polymesh->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (polymesh->super_Instance).name._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).name.field_2;
          (polymesh->super_Instance).name.field_2._M_local_buf[0] = '\0';
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (polymesh->vertices).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (polymesh->normals).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (polymesh->normals).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (polymesh->normals).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (polymesh->texcoords).
          super__Vector_base<CS248::Vector2D,_std::allocator<CS248::Vector2D>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (polymesh->texcoords).
          super__Vector_base<CS248::Vector2D,_std::allocator<CS248::Vector2D>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (polymesh->texcoords).
          super__Vector_base<CS248::Vector2D,_std::allocator<CS248::Vector2D>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (polymesh->polygons).
          super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (polymesh->polygons).
          super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (polymesh->polygons).
          super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          parse_polymesh(xml_01,polymesh);
          std::__cxx11::string::string
                    ((string *)&local_3c0,
                     "instance_geometry/bind_material/technique_common/instance_material",
                     (allocator *)&mat);
          pXVar4 = get_element(xml,&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          node.instance = (Instance *)polymesh;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_00172f49;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar5 == (char *)0x0) {
LAB_001732cb:
            exit(1);
          }
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          std::__cxx11::string::string((string *)&mat,pcVar5 + 1,(allocator *)&s);
          std::__cxx11::string::string((string *)&local_3e0,(string *)&mat);
          pXVar4 = uri_find(&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001732cb;
          pMVar6 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar6->super_Instance = 0;
          (pMVar6->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar6->super_Instance).id._M_string_length = 0;
          (pMVar6->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar6->super_Instance).id.field_2 + 8) = 0;
          (pMVar6->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar6->super_Instance).name._M_string_length = 0;
          (pMVar6->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar6->super_Instance).name.field_2 + 8) = 0;
          pMVar6->bsdf = (BSDF *)0x0;
          (pMVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).id.field_2;
          (pMVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).name.field_2;
          (pMVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar6);
          polymesh->material = pMVar6;
        }
        std::__cxx11::string::~string((string *)&mat);
        node.instance = &polymesh->super_Instance;
      }
    }
    else {
      this = (LightInfo *)operator_new(0xb8);
      LightInfo::LightInfo(this);
      parse_light(xml_00,this);
      node.instance = (Instance *)this;
    }
  }
  else {
    camera = (CameraInfo *)operator_new(0x88);
    memset(camera,0,0x88);
    (camera->super_Instance).id._M_dataplus._M_p = (pointer)&(camera->super_Instance).id.field_2;
    (camera->super_Instance).id.field_2._M_local_buf[0] = '\0';
    (camera->super_Instance).name._M_dataplus._M_p = (pointer)&(camera->super_Instance).name.field_2
    ;
    (camera->super_Instance).name.field_2._M_local_buf[0] = '\0';
    (camera->view_dir).x = 0.0;
    (camera->view_dir).y = 0.0;
    (camera->view_dir).z = 0.0;
    (camera->up_dir).x = 0.0;
    (camera->up_dir).y = 0.0;
    (camera->up_dir).z = 0.0;
    parse_camera(pXVar4,camera);
    node.instance = (Instance *)camera;
  }
LAB_00172f49:
  std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::push_back(scene,&node);
  Node::~Node(&node);
  return;
}

Assistant:

void ColladaParser::parse_node(XMLElement* xml) {
  // create new node
  Node node = Node();

  // name & id
  node.id = xml->Attribute("id");
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {
    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {
      string s = e->GetText();
      stringstream ss(s);

      Matrix4x4 mat;
      ss >> mat(0, 0);
      ss >> mat(0, 1);
      ss >> mat(0, 2);
      ss >> mat(0, 3);
      ss >> mat(1, 0);
      ss >> mat(1, 1);
      ss >> mat(1, 2);
      ss >> mat(1, 3);
      ss >> mat(2, 0);
      ss >> mat(2, 1);
      ss >> mat(2, 2);
      ss >> mat(2, 3);
      ss >> mat(3, 0);
      ss >> mat(3, 1);
      ss >> mat(3, 2);
      ss >> mat(3, 3);

      node.transform = mat;
      break;
    }

    // transformation - rotate
    if (name == "rotate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1, 1);
          ss >> m(1, 2);
          ss >> m(2, 1);
          ss >> m(2, 2);
          break;
        case 'Y':
          ss >> m(0, 0);
          ss >> m(2, 0);
          ss >> m(0, 2);
          ss >> m(2, 2);
          break;
        case 'Z':
          ss >> m(0, 0);
          ss >> m(0, 1);
          ss >> m(1, 0);
          ss >> m(1, 1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;
    }

    // transformation - translate
    if (name == "translate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 3);
      ss >> m(1, 3);
      ss >> m(2, 3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 0);
      ss >> m(1, 1);
      ss >> m(1, 1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera = get_element(xml, "instance_camera");
  XMLElement* e_light = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera(e_camera, *camera);
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light(e_light, *light);
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {
      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {
      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;
    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}